

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O2

Error asmjit::v1_14::x86::FormatterInternal_formatImmText
                (String *sb,uint32_t imm8,uint32_t bits,uint32_t advance,char *text,uint32_t count)

{
  char cVar1;
  Error EVar2;
  int iVar3;
  char *str;
  uint32_t i;
  uint32_t uVar4;
  int iVar5;
  
  uVar4 = 0;
  iVar5 = 0;
  while( true ) {
    if (uVar4 == count) {
      EVar2 = String::_opChar(sb,kAppend,'}');
      return EVar2;
    }
    EVar2 = String::_opChar(sb,kAppend,'|' - (uVar4 == 0));
    if (EVar2 != 0) break;
    str = text;
    for (iVar3 = 0; iVar3 != (imm8 & ~(-1 << ((byte)bits & 0x1f))) + iVar5; iVar3 = iVar3 + 1) {
      do {
        cVar1 = *str;
        str = str + 1;
      } while (cVar1 != '\0');
    }
    EVar2 = String::_opString(sb,kAppend,str,0xffffffffffffffff);
    if (EVar2 != 0) {
      return EVar2;
    }
    uVar4 = uVar4 + 1;
    imm8 = imm8 >> ((byte)bits & 0x1f);
    iVar5 = iVar5 + advance;
  }
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error FormatterInternal_formatImmText(String& sb, uint32_t imm8, uint32_t bits, uint32_t advance, const char* text, uint32_t count = 1) noexcept {
  uint32_t mask = (1u << bits) - 1;
  uint32_t pos = 0;

  for (uint32_t i = 0; i < count; i++, imm8 >>= bits, pos += advance) {
    uint32_t value = (imm8 & mask) + pos;
    ASMJIT_PROPAGATE(sb.append(i == 0 ? kImmCharStart : kImmCharOr));
    ASMJIT_PROPAGATE(sb.append(Support::findPackedString(text, value)));
  }

  return sb.append(kImmCharEnd);
}